

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::compressedtexsubimage2d(NegativeTestContext *ctx)

{
  NegativeTestContext *pNVar1;
  int iVar2;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  GLuint local_48 [2];
  deUint32 texture;
  allocator<char> local_31;
  string local_30;
  NegativeTestContext *local_10;
  NegativeTestContext *ctx_local;
  
  local_10 = ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"GL_INVALID_ENUM is generated if target is invalid.",&local_31);
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  glu::CallLogWrapper::glCompressedTexSubImage2D
            (&local_10->super_CallLogWrapper,0,0,0,0,0,0,0x9274,0,(void *)0x0);
  NegativeTestContext::expectError(local_10,0x500);
  NegativeTestContext::endSection(local_10);
  local_48[0] = 0x1234;
  glu::CallLogWrapper::glGenTextures(&local_10->super_CallLogWrapper,1,local_48);
  glu::CallLogWrapper::glBindTexture(&local_10->super_CallLogWrapper,0xde1,local_48[0]);
  pNVar1 = local_10;
  iVar2 = etc2EacDataSize(0x12,0x12);
  glu::CallLogWrapper::glCompressedTexImage2D
            (&pNVar1->super_CallLogWrapper,0xde1,0,0x9278,0x12,0x12,0,iVar2,(void *)0x0);
  NegativeTestContext::expectError(local_10,0);
  pNVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,
             "GL_INVALID_OPERATION is generated if format does not match the internal format of the texture image being modified."
             ,&local_69);
  NegativeTestContext::beginSection(pNVar1,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  glu::CallLogWrapper::glCompressedTexSubImage2D
            (&local_10->super_CallLogWrapper,0xde1,0,0,0,0,0,0x9274,0,(void *)0x0);
  NegativeTestContext::expectError(local_10,0x502);
  NegativeTestContext::endSection(local_10);
  pNVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,
             "For ETC2/EAC images GL_INVALID_OPERATION is generated if width is not a multiple of four, and width + xoffset is not equal to the width of the texture level."
             ,&local_91);
  NegativeTestContext::beginSection(pNVar1,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  pNVar1 = local_10;
  iVar2 = etc2EacDataSize(10,4);
  glu::CallLogWrapper::glCompressedTexSubImage2D
            (&pNVar1->super_CallLogWrapper,0xde1,0,4,0,10,4,0x9278,iVar2,(void *)0x0);
  NegativeTestContext::expectError(local_10,0x502);
  NegativeTestContext::endSection(local_10);
  pNVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,
             "For ETC2/EAC images GL_INVALID_OPERATION is generated if height is not a multiple of four, and height + yoffset is not equal to the height of the texture level."
             ,&local_b9);
  NegativeTestContext::beginSection(pNVar1,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  pNVar1 = local_10;
  iVar2 = etc2EacDataSize(4,10);
  glu::CallLogWrapper::glCompressedTexSubImage2D
            (&pNVar1->super_CallLogWrapper,0xde1,0,0,4,4,10,0x9278,iVar2,(void *)0x0);
  NegativeTestContext::expectError(local_10,0x502);
  NegativeTestContext::endSection(local_10);
  pNVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,
             "For ETC2/EAC images GL_INVALID_OPERATION is generated if xoffset or yoffset is not a multiple of four."
             ,&local_e1);
  NegativeTestContext::beginSection(pNVar1,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  pNVar1 = local_10;
  iVar2 = etc2EacDataSize(4,4);
  glu::CallLogWrapper::glCompressedTexSubImage2D
            (&pNVar1->super_CallLogWrapper,0xde1,0,0,1,4,4,0x9278,iVar2,(void *)0x0);
  NegativeTestContext::expectError(local_10,0x502);
  pNVar1 = local_10;
  iVar2 = etc2EacDataSize(4,4);
  glu::CallLogWrapper::glCompressedTexSubImage2D
            (&pNVar1->super_CallLogWrapper,0xde1,0,1,0,4,4,0x9278,iVar2,(void *)0x0);
  NegativeTestContext::expectError(local_10,0x502);
  pNVar1 = local_10;
  iVar2 = etc2EacDataSize(4,4);
  glu::CallLogWrapper::glCompressedTexSubImage2D
            (&pNVar1->super_CallLogWrapper,0xde1,0,1,1,4,4,0x9278,iVar2,(void *)0x0);
  NegativeTestContext::expectError(local_10,0x502);
  NegativeTestContext::endSection(local_10);
  glu::CallLogWrapper::glDeleteTextures(&local_10->super_CallLogWrapper,1,local_48);
  return;
}

Assistant:

void compressedtexsubimage2d (NegativeTestContext& ctx)
{
	ctx.beginSection("GL_INVALID_ENUM is generated if target is invalid.");
	ctx.glCompressedTexSubImage2D(0, 0, 0, 0, 0, 0, GL_COMPRESSED_RGB8_ETC2, 0, 0);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	deUint32				texture = 0x1234;
	ctx.glGenTextures			(1, &texture);
	ctx.glBindTexture			(GL_TEXTURE_2D, texture);
	ctx.glCompressedTexImage2D	(GL_TEXTURE_2D, 0, GL_COMPRESSED_RGBA8_ETC2_EAC, 18, 18, 0, etc2EacDataSize(18, 18), 0);
	ctx.expectError				(GL_NO_ERROR);

	ctx.beginSection("GL_INVALID_OPERATION is generated if format does not match the internal format of the texture image being modified.");
	ctx.glCompressedTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, 0, 0, GL_COMPRESSED_RGB8_ETC2, 0, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("For ETC2/EAC images GL_INVALID_OPERATION is generated if width is not a multiple of four, and width + xoffset is not equal to the width of the texture level.");
	ctx.glCompressedTexSubImage2D(GL_TEXTURE_2D, 0, 4, 0, 10, 4, GL_COMPRESSED_RGBA8_ETC2_EAC, etc2EacDataSize(10, 4), 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("For ETC2/EAC images GL_INVALID_OPERATION is generated if height is not a multiple of four, and height + yoffset is not equal to the height of the texture level.");
	ctx.glCompressedTexSubImage2D(GL_TEXTURE_2D, 0, 0, 4, 4, 10, GL_COMPRESSED_RGBA8_ETC2_EAC, etc2EacDataSize(4, 10), 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("For ETC2/EAC images GL_INVALID_OPERATION is generated if xoffset or yoffset is not a multiple of four.");
	ctx.glCompressedTexSubImage2D(GL_TEXTURE_2D, 0, 0, 1, 4, 4, GL_COMPRESSED_RGBA8_ETC2_EAC, etc2EacDataSize(4, 4), 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glCompressedTexSubImage2D(GL_TEXTURE_2D, 0, 1, 0, 4, 4, GL_COMPRESSED_RGBA8_ETC2_EAC, etc2EacDataSize(4, 4), 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glCompressedTexSubImage2D(GL_TEXTURE_2D, 0, 1, 1, 4, 4, GL_COMPRESSED_RGBA8_ETC2_EAC, etc2EacDataSize(4, 4), 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.glDeleteTextures		(1, &texture);
}